

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

string * google::protobuf::compiler::objectivec::
         GetOptionalDeprecatedAttribute<google::protobuf::EnumValueDescriptor>
                   (string *__return_storage_ptr__,EnumValueDescriptor *descriptor,
                   FileDescriptor *file)

{
  bool bVar1;
  string *psVar2;
  AlphaNum *in_R8;
  AlphaNum *in_R9;
  string message;
  char *local_118;
  size_t local_110;
  char local_108;
  undefined7 uStack_107;
  undefined1 local_f8 [48];
  string local_c8;
  AlphaNum local_a8;
  size_type local_78;
  AlphaNum *local_70;
  AlphaNum local_48;
  
  bVar1 = (descriptor->options_->field_0)._impl_.deprecated_;
  if (file == (FileDescriptor *)0x0 || bVar1 != false) {
    if (bVar1 == false) {
LAB_0036084b:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    local_118 = &local_108;
    local_110 = 0;
    local_108 = '\0';
    local_70 = (AlphaNum *)descriptor->all_names_[1]._M_dataplus._M_p;
    local_78 = descriptor->all_names_[1]._M_string_length;
    local_a8.piece_._M_len = 0x14;
    local_a8.piece_._M_str = " is deprecated (see ";
    psVar2 = descriptor->type_->file_->name_;
    local_f8._8_8_ = (psVar2->_M_dataplus)._M_p;
    local_f8._0_8_ = psVar2->_M_string_length;
    in_R8 = &local_48;
    local_48.piece_._M_len = 2;
    local_48.piece_._M_str = ").";
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_c8,(lts_20250127 *)&local_78,&local_a8,(AlphaNum *)local_f8,in_R8,in_R9);
    std::__cxx11::string::operator=((string *)&local_118,(string *)&local_c8);
    local_f8._16_8_ = local_c8.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == &local_c8.field_2) goto LAB_003607e5;
  }
  else {
    if ((file->options_->field_0)._impl_.deprecated_ == false) goto LAB_0036084b;
    local_118 = &local_108;
    local_110 = 0;
    local_108 = '\0';
    psVar2 = descriptor->type_->file_->name_;
    local_70 = (AlphaNum *)(psVar2->_M_dataplus)._M_p;
    local_78 = psVar2->_M_string_length;
    local_a8.piece_._M_len = 0xf;
    local_a8.piece_._M_str = " is deprecated.";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_f8,(lts_20250127 *)&local_78,&local_a8,local_70);
    std::__cxx11::string::operator=((string *)&local_118,(string *)local_f8);
    local_c8._M_dataplus._M_p = (pointer)local_f8._0_8_;
    if ((undefined1 *)local_f8._0_8_ == local_f8 + 0x10) goto LAB_003607e5;
  }
  operator_delete(local_c8._M_dataplus._M_p,local_f8._16_8_ + 1);
LAB_003607e5:
  local_78 = 0x14;
  local_70 = (AlphaNum *)0x5eb182;
  local_a8.piece_._M_len = local_110;
  local_a8.piece_._M_str = local_118;
  local_f8._0_8_ = (pointer)0x2;
  local_f8._8_8_ = "\")";
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_78,&local_a8,(AlphaNum *)local_f8,in_R8);
  if (local_118 != &local_108) {
    operator_delete(local_118,CONCAT71(uStack_107,local_108) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetOptionalDeprecatedAttribute(
    const TDescriptor* descriptor, const FileDescriptor* file = nullptr) {
  bool isDeprecated = descriptor->options().deprecated();
  // The file is only passed when checking Messages & Enums, so those types
  // get tagged. At the moment, it doesn't seem to make sense to tag every
  // field or enum value with when the file is deprecated.
  bool isFileLevelDeprecation = false;
  if (!isDeprecated && file) {
    isFileLevelDeprecation = file->options().deprecated();
    isDeprecated = isFileLevelDeprecation;
  }
  if (isDeprecated) {
    std::string message;
    const FileDescriptor* sourceFile = descriptor->file();
    if (isFileLevelDeprecation) {
      message = absl::StrCat(sourceFile->name(), " is deprecated.");
    } else {
      message = absl::StrCat(descriptor->full_name(), " is deprecated (see ",
                             sourceFile->name(), ").");
    }

    return absl::StrCat("GPB_DEPRECATED_MSG(\"", message, "\")");
  } else {
    return "";
  }
}